

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

bool __thiscall google::protobuf::FieldDescriptor::is_repeated(FieldDescriptor *this)

{
  bool bVar1;
  
  bVar1 = (bool)((this->field_0x1 & 0x20) >> 5);
  if (0xbf < (byte)this->field_0x1 == bVar1) {
    return bVar1;
  }
  is_repeated();
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  ABSL_DCHECK_EQ(is_repeated_, static_cast<Label>(label_) == LABEL_REPEATED);
  return is_repeated_;
}